

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorConicGradientInstancer::InstanceDecorator
          (DecoratorConicGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Array<const_Property_*,_2> p_position;
  bool bVar1;
  Property *this_00;
  Property *pPVar2;
  Property *pPVar3;
  Property *pPVar4;
  NumericValue value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  float in_angle;
  Vector2Numeric in_position;
  SharedPtr<Decorator> SVar6;
  SharedPtr<Rml::DecoratorConicGradient> decorator;
  DecoratorConicGradient *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  _Var5._M_pi = extraout_RDX;
  if ((pPVar2 != (Property *)0x0 && this_00 != (Property *)0x0) &&
     (pPVar3 != (Property *)0x0 && pPVar4 != (Property *)0x0)) {
    value = Property::GetNumericValue(this_00);
    in_angle = ComputeAngle(value);
    p_position._M_elems[1] = (Property *)in_stack_ffffffffffffffc0._M_pi;
    p_position._M_elems[0] = (Property *)in_stack_ffffffffffffffb8;
    in_position = ComputePosition(p_position);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              properties_,"repeating-conic-gradient");
    _Var5._M_pi = extraout_RDX_00;
    if (pPVar4->unit == COLORSTOPLIST) {
      ::std::make_shared<Rml::DecoratorConicGradient>();
      bVar1 = DecoratorConicGradient::Initialise
                        (in_stack_ffffffffffffffb8,bVar1,in_angle,in_position,
                         (ColorStopList *)(pPVar4->value).data);
      if (bVar1) {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
             (_func_int **)in_stack_ffffffffffffffb8;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffffc0._M_pi;
      }
      else {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
      _Var5._M_pi = extraout_RDX_01;
      goto LAB_0027509b;
    }
  }
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0027509b:
  SVar6.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar6.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar6.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorConicGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	const float angle = ComputeAngle(p_angle->GetNumericValue());
	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-conic-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorConicGradient>();
	if (decorator->Initialise(repeating, angle, position, color_stop_list))
		return decorator;

	return nullptr;
}